

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

int __thiscall
r_code::list<core::P<r_exec::_Fact>_>::remove(list<core::P<r_exec::_Fact>_> *this,char *__filename)

{
  pointer pcVar1;
  const_iterator cVar2;
  const_iterator local_10;
  
  local_10.super__iterator._cell = this->used_cells_head;
  if (local_10.super__iterator._cell != list<core::P<r_exec::_Fact>>::end_iterator) {
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pcVar1[local_10.super__iterator._cell].data.object == *(_Object **)__filename) {
        local_10._list = this;
        cVar2 = erase(this,&local_10);
        local_10.super__iterator = cVar2.super__iterator._cell;
        break;
      }
      local_10.super__iterator._cell = pcVar1[local_10.super__iterator._cell].next;
    } while (local_10.super__iterator._cell != list<core::P<r_exec::_Fact>>::end_iterator);
  }
  return (int)local_10.super__iterator._cell;
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }